

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicKReach.cpp
# Opt level: O2

void __thiscall
DynamicKReach::fix_changes
          (DynamicKReach *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  DistanceQueue *this_00;
  byte bVar1;
  value_type vVar2;
  vertex_t v;
  pointer puVar3;
  uint *puVar4;
  pointer ppVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  byte *pbVar7;
  reference pvVar8;
  uint *prv;
  uint *puVar9;
  uint *w;
  pointer puVar10;
  uint uVar11;
  
  puVar3 = (this->updated_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = &this->quedist_;
  for (puVar10 = (this->updated_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start; puVar10 != puVar3; puVar10 = puVar10 + 1)
  {
    pvVar6 = Graph::predecessors(this->graph_,*puVar10);
    puVar4 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar9 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; puVar9 != puVar4; puVar9 = puVar9 + 1) {
      pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar9);
      bVar1 = *pbVar7;
      pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar10);
      if (bVar1 + 1 < (uint)*pbVar7) {
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar9)
        ;
        vVar2 = *pvVar8;
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           (dist,(ulong)*puVar10);
        *pvVar8 = vVar2 + '\x01';
      }
    }
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar10);
    std::
    priority_queue<std::pair<unsigned_char,unsigned_int>,std::vector<std::pair<unsigned_char,unsigned_int>,std::allocator<std::pair<unsigned_char,unsigned_int>>>,std::greater<std::pair<unsigned_char,unsigned_int>>>
    ::emplace<unsigned_char&,unsigned_int_const&>
              ((priority_queue<std::pair<unsigned_char,unsigned_int>,std::vector<std::pair<unsigned_char,unsigned_int>,std::allocator<std::pair<unsigned_char,unsigned_int>>>,std::greater<std::pair<unsigned_char,unsigned_int>>>
                *)this_00,pvVar8,puVar10);
  }
  while (ppVar5 = (this->quedist_).c.
                  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        ppVar5 != (this->quedist_).c.
                  super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = ppVar5->first;
    v = ppVar5->second;
    std::
    priority_queue<std::pair<unsigned_char,_unsigned_int>,_std::vector<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>,_std::greater<std::pair<unsigned_char,_unsigned_int>_>_>
    ::pop(this_00);
    if (bVar1 < this->k_) {
      pvVar6 = Graph::successors(this->graph_,v);
      puVar3 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar11 = bVar1 + 1;
      for (puVar10 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start; puVar10 != puVar3;
          puVar10 = puVar10 + 1) {
        pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           (dist,(ulong)*puVar10);
        if (uVar11 < *pbVar7) {
          pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             (dist,(ulong)*puVar10);
          *pvVar8 = (value_type)uVar11;
          pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             (dist,(ulong)*puVar10);
          std::
          priority_queue<std::pair<unsigned_char,unsigned_int>,std::vector<std::pair<unsigned_char,unsigned_int>,std::allocator<std::pair<unsigned_char,unsigned_int>>>,std::greater<std::pair<unsigned_char,unsigned_int>>>
          ::emplace<unsigned_char&,unsigned_int_const&>
                    ((priority_queue<std::pair<unsigned_char,unsigned_int>,std::vector<std::pair<unsigned_char,unsigned_int>,std::allocator<std::pair<unsigned_char,unsigned_int>>>,std::greater<std::pair<unsigned_char,unsigned_int>>>
                      *)this_00,pvVar8,puVar10);
        }
      }
    }
  }
  return;
}

Assistant:

void DynamicKReach::fix_changes(std::vector<distance_t> &dist) {
    for (const auto &w : updated_) {
        for (const auto &prv : graph_.predecessors(w)) {
            if (dist.at(prv) + 1 < dist.at(w)) {
                dist.at(w) = dist.at(prv) + 1;
            }
        }
        quedist_.emplace(dist.at(w), w);
    }
    while (!quedist_.empty()) {
        auto d = quedist_.top().first;
        auto w = quedist_.top().second;
        quedist_.pop();
        if (d >= k_) {
            continue;
        }
        for (const auto &nxt : graph_.successors(w)) {
            if (dist.at(nxt) > d + 1) {
                dist.at(nxt) = d + 1;
                quedist_.emplace(dist.at(nxt), nxt);
            }
        }
    }
}